

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O0

void __thiscall
Storage::Disk::MacintoshIMG::construct_raw_gcr(MacintoshIMG *this,size_t offset,size_t size)

{
  stat *psVar1;
  undefined4 *puVar2;
  size_t __nbytes;
  undefined1 local_50 [24];
  undefined1 local_38 [32];
  size_t size_local;
  size_t offset_local;
  MacintoshIMG *this_local;
  
  this->is_diskCopy_file_ = false;
  local_38._24_8_ = size;
  size_local = offset;
  offset_local = (size_t)this;
  if (size == 0) {
    psVar1 = FileHolder::stats(&this->file_);
    local_38._24_8_ = psVar1->st_size;
  }
  if ((local_38._24_8_ != 0xc8000) && (local_38._24_8_ != 0x64000)) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xfffffffe;
    __cxa_throw(puVar2,&Error::typeinfo,0);
  }
  this->raw_offset_ = size_local;
  __nbytes = size_local;
  FileHolder::seek(&this->file_,this->raw_offset_,0);
  if (local_38._24_8_ == 0xc8000) {
    this->encoding_ = GCR800;
    this->format_ = '\"';
    FileHolder::read((FileHolder *)local_38,(int)this + 8,(void *)0xc8000,__nbytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  }
  else {
    this->encoding_ = GCR400;
    this->format_ = '\x02';
    FileHolder::read((FileHolder *)local_50,(int)this + 8,(void *)0x64000,__nbytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  }
  return;
}

Assistant:

void MacintoshIMG::construct_raw_gcr(size_t offset, size_t size) {
	is_diskCopy_file_ = false;
	if(size == 0) {
		size = size_t(file_.stats().st_size);
	}
	if(size != 819200 && size != 409600)
		throw Error::InvalidFormat;

	raw_offset_ = long(offset);
	file_.seek(raw_offset_, SEEK_SET);
	if(size == 819200) {
		encoding_ = Encoding::GCR800;
		format_ = 0x22;
		data_ = file_.read(819200);
	} else {
		encoding_ = Encoding::GCR400;
		format_ = 0x02;
		data_ = file_.read(409600);
	}
}